

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O2

String * __thiscall
Diligent::GetResourceStateString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,RESOURCE_STATE State)

{
  RESOURCE_STATE RVar1;
  ulong uVar2;
  allocator local_21;
  
  if ((int)this == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,"UNKNOWN",&local_21);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    uVar2 = (ulong)this & 0xffffffff;
    while (RVar1 = (RESOURCE_STATE)uVar2, RVar1 != RESOURCE_STATE_UNKNOWN) {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      GetResourceStateFlagString(-RVar1 & RVar1);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      uVar2 = (ulong)(RVar1 ^ -RVar1 & RVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetResourceStateString(RESOURCE_STATE State)
{
    if (State == RESOURCE_STATE_UNKNOWN)
        return "UNKNOWN";

    String str;
    while (State != 0)
    {
        if (!str.empty())
            str.push_back('|');

        Uint32 lsb = State & ~(State - 1);

        const char* StateFlagString = GetResourceStateFlagString(static_cast<RESOURCE_STATE>(lsb));
        str.append(StateFlagString);
        State = static_cast<RESOURCE_STATE>(State & ~lsb);
    }
    return str;
}